

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)

{
  TargetType TVar1;
  cmGeneratorTarget *in_RSI;
  __uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
  in_RDI;
  cmGeneratorTarget *local_20 [2];
  
  *(undefined8 *)
   in_RDI.
   super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
   ._M_t.
   super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
   .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl = 0;
  TVar1 = cmGeneratorTarget::GetType(in_RSI);
  switch(TVar1) {
  case EXECUTABLE:
    std::make_unique<cmMakefileExecutableTargetGenerator,cmGeneratorTarget*&>(local_20);
    break;
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
  case OBJECT_LIBRARY:
    std::make_unique<cmMakefileLibraryTargetGenerator,cmGeneratorTarget*&>(local_20);
    break;
  case UTILITY:
  case INTERFACE_LIBRARY:
    std::make_unique<cmMakefileUtilityTargetGenerator,cmGeneratorTarget*&>(local_20);
    break;
  default:
    goto switchD_003afc22_caseD_6;
  }
  *(cmGeneratorTarget **)
   in_RDI.
   super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
   ._M_t.
   super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
   .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl = local_20[0];
switchD_003afc22_caseD_6:
  return (__uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
          )(tuple<cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>)
           in_RDI.
           super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmMakefileTargetGenerator> cmMakefileTargetGenerator::New(
  cmGeneratorTarget* tgt)
{
  std::unique_ptr<cmMakefileTargetGenerator> result;

  switch (tgt->GetType()) {
    case cmStateEnums::EXECUTABLE:
      result = cm::make_unique<cmMakefileExecutableTargetGenerator>(tgt);
      break;
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      result = cm::make_unique<cmMakefileLibraryTargetGenerator>(tgt);
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UTILITY:
      result = cm::make_unique<cmMakefileUtilityTargetGenerator>(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
  }
  return result;
}